

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::openWebSocket
          (NetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  _func_int *p_Var1;
  RefcountedClient *pRVar2;
  void *pvVar3;
  SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5989:9)>
  *location;
  StringPtr url_00;
  Promise<kj::HttpClient::WebSocketResponse> result;
  void *continuationTracePtr;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  undefined1 local_68 [16];
  HttpInputStream local_58;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> local_50;
  code *local_48;
  HttpClient local_40;
  RefcountedClient *local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  url_00.content.size_ = url.content.size_;
  getClient((NetworkAddressHttpClient *)&stack0xffffffffffffffc0);
  pRVar2 = local_38;
  url_00.content.ptr = (char *)(local_38->client).ptr;
  HttpClientImpl::openWebSocket((HttpClientImpl *)local_68,url_00,headers);
  local_68._8_8_ = local_40._vptr_HttpClient;
  local_38 = (RefcountedClient *)0x0;
  local_58._vptr_HttpInputStream = (_func_int **)pRVar2;
  local_48 = kj::_::
             SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5989:9)>
             ::anon_class_16_1_81fbabb9_for_func::operator();
  p_Var1 = *(_func_int **)(local_68._0_8_ + 8);
  if (p_Var1 == (_func_int *)0x0 || (ulong)(local_68._0_8_ - (long)p_Var1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5989:9)>
                *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,kj::(anonymous_namespace)::NetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_68,
               (anon_class_16_1_81fbabb9_for_func *)(local_68 + 8),&local_48);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    *(_func_int **)(local_68._0_8_ + 8) = (_func_int *)0x0;
    location = (SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:5989:9)>
                *)(local_68._0_8_ + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,kj::(anonymous_namespace)::NetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::HttpClient::WebSocketResponse&&)_1_,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_68,
               (anon_class_16_1_81fbabb9_for_func *)(local_68 + 8),&local_48);
    *(_func_int **)(local_68._0_8_ + -0x28) = p_Var1;
  }
  local_50.currentWrapper.ptr =
       (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
       (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)location;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffd0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)(local_68 + 8));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_68);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)&stack0xffffffffffffffc0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    auto refcounted = getClient();
    auto result = refcounted->client->openWebSocket(url, headers);
    return result.then(
        [refcounted=kj::mv(refcounted)](WebSocketResponse&& response) mutable {
      KJ_SWITCH_ONEOF(response.webSocketOrBody) {
        KJ_CASE_ONEOF(body, kj::Own<kj::AsyncInputStream>) {
          response.webSocketOrBody = body.attach(kj::mv(refcounted));
        }
        KJ_CASE_ONEOF(ws, kj::Own<WebSocket>) {
          // The only reason we need to attach the client to the WebSocket is because otherwise
          // the response headers will be deleted prematurely. Otherwise, the WebSocket has taken
          // ownership of the connection.
          //
          // TODO(perf): Maybe we could transfer ownership of the response headers specifically?
          response.webSocketOrBody = ws.attach(kj::mv(refcounted));
        }
      }
      return kj::mv(response);
    });
  }